

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx512::LineSegmentsISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,PrimRef *prims,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  unsigned_long uVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar13 = r->_begin;
  auVar18._8_4_ = 0x7f800000;
  auVar18._0_8_ = 0x7f8000007f800000;
  auVar18._12_4_ = 0x7f800000;
  auVar19 = ZEXT1664(auVar18);
  auVar16._8_4_ = 0xff800000;
  auVar16._0_8_ = 0xff800000ff800000;
  auVar16._12_4_ = 0xff800000;
  auVar17 = ZEXT1664(auVar16);
  sVar10 = 0;
  auVar20._8_4_ = 0xddccb9a2;
  auVar20._0_8_ = 0xddccb9a2ddccb9a2;
  auVar20._12_4_ = 0xddccb9a2;
  auVar21._8_4_ = 0x5dccb9a2;
  auVar21._0_8_ = 0x5dccb9a25dccb9a2;
  auVar21._12_4_ = 0x5dccb9a2;
  auVar22 = ZEXT1664(auVar16);
  auVar23 = ZEXT1664(auVar18);
  while( true ) {
    if (r->_end <= uVar13) break;
    pBVar2 = (this->super_LineSegments).vertices.items;
    uVar1 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                     *(long *)&(this->super_LineSegments).field_0x68 * uVar13);
    uVar14 = (ulong)(uVar1 + 1);
    sVar11 = k;
    if (uVar14 < (pBVar2->super_RawBufferView).num) {
      pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
      sVar4 = (pBVar2->super_RawBufferView).stride;
      auVar16 = *(undefined1 (*) [16])(pcVar3 + sVar4 * uVar1);
      uVar8 = vcmpps_avx512vl(auVar16,auVar20,6);
      uVar9 = vcmpps_avx512vl(auVar16,auVar21,1);
      if ((byte)((byte)uVar8 & (byte)uVar9) == 0xf) {
        auVar18 = *(undefined1 (*) [16])(pcVar3 + sVar4 * uVar14);
        uVar8 = vcmpps_avx512vl(auVar18,auVar20,6);
        uVar9 = vcmpps_avx512vl(auVar18,auVar21,1);
        if ((byte)((byte)uVar8 & (byte)uVar9) == 0xf) {
          auVar16 = vshufps_avx(auVar16,auVar16,0xff);
          auVar18 = vshufps_avx(auVar18,auVar18,0xff);
          auVar16 = vminss_avx(auVar16,auVar18);
          if (0.0 <= auVar16._0_4_) {
            pcVar3 = (this->super_LineSegments).vertices0.super_RawBufferView.ptr_ofs;
            sVar11 = (this->super_LineSegments).vertices0.super_RawBufferView.stride;
            lVar12 = uVar1 * sVar11;
            lVar15 = uVar14 * sVar11;
            auVar24 = vminps_avx(*(undefined1 (*) [16])(pcVar3 + lVar12),
                                 *(undefined1 (*) [16])(pcVar3 + lVar15));
            auVar16 = vmaxps_avx(*(undefined1 (*) [16])(pcVar3 + lVar12),
                                 *(undefined1 (*) [16])(pcVar3 + lVar15));
            auVar18 = vmaxss_avx(ZEXT416(*(uint *)(pcVar3 + lVar15 + 0xc)),
                                 ZEXT416(*(uint *)(pcVar3 + lVar12 + 0xc)));
            fVar7 = auVar18._0_4_ * (this->super_LineSegments).maxRadiusScale;
            auVar25._4_4_ = fVar7;
            auVar25._0_4_ = fVar7;
            auVar25._8_4_ = fVar7;
            auVar25._12_4_ = fVar7;
            auVar18 = vsubps_avx(auVar24,auVar25);
            aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar18,ZEXT416(geomID),0x30);
            auVar24._0_4_ = auVar16._0_4_ + fVar7;
            auVar24._4_4_ = auVar16._4_4_ + fVar7;
            auVar24._8_4_ = auVar16._8_4_ + fVar7;
            auVar24._12_4_ = auVar16._12_4_ + fVar7;
            aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar24,ZEXT416((uint)uVar13),0x30);
            auVar16 = vminps_avx((undefined1  [16])auVar23._0_16_,(undefined1  [16])aVar5);
            auVar23 = ZEXT1664(auVar16);
            auVar16 = vmaxps_avx((undefined1  [16])auVar22._0_16_,(undefined1  [16])aVar6);
            auVar22 = ZEXT1664(auVar16);
            auVar26._0_4_ = aVar5.x + aVar6.x;
            auVar26._4_4_ = aVar5.y + aVar6.y;
            auVar26._8_4_ = aVar5.z + aVar6.z;
            auVar26._12_4_ = aVar5.field_3.w + aVar6.field_3.w;
            auVar16 = vminps_avx((undefined1  [16])auVar19._0_16_,auVar26);
            auVar19 = ZEXT1664(auVar16);
            auVar16 = vmaxps_avx((undefined1  [16])auVar17._0_16_,auVar26);
            auVar17 = ZEXT1664(auVar16);
            sVar10 = sVar10 + 1;
            sVar11 = k + 1;
            prims[k].upper.field_0.field_1 = aVar6;
            prims[k].lower.field_0.field_1 = aVar5;
          }
        }
      }
    }
    uVar13 = uVar13 + 1;
    k = sVar11;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       auVar23._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       auVar22._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       auVar19._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       auVar17._0_16_;
  __return_storage_ptr__->end = sVar10;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,&bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }